

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

bool __thiscall
testing::internal::MaxBipartiteMatchState::TryAugment
          (MaxBipartiteMatchState *this,size_t ilhs,vector<char,_std::allocator<char>_> *seen)

{
  pointer pcVar1;
  size_t ilhs_00;
  bool bVar2;
  MatchMatrix *pMVar3;
  ulong uVar4;
  unsigned_long uVar5;
  bool bVar6;
  
  pMVar3 = this->graph_;
  uVar4 = pMVar3->num_matchers_;
  bVar6 = uVar4 != 0;
  if (bVar6) {
    uVar5 = 0;
    do {
      pcVar1 = (seen->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pcVar1[uVar5] == '\0') &&
         ((pMVar3->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5 + uVar4 * ilhs] == '\x01')) {
        pcVar1[uVar5] = '\x01';
        ilhs_00 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
        if ((ilhs_00 == 0xffffffffffffffff) || (bVar2 = TryAugment(this,ilhs_00,seen), bVar2)) {
          (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[ilhs] = uVar5;
          (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = ilhs;
          return bVar6;
        }
      }
      uVar5 = uVar5 + 1;
      pMVar3 = this->graph_;
      uVar4 = pMVar3->num_matchers_;
      bVar6 = uVar5 < uVar4;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool TryAugment(size_t ilhs, ::std::vector<char>* seen) {
    for (size_t irhs = 0; irhs < graph_->RhsSize(); ++irhs) {
      if ((*seen)[irhs]) continue;
      if (!graph_->HasEdge(ilhs, irhs)) continue;
      // There's an available edge from ilhs to irhs.
      (*seen)[irhs] = 1;
      // Next a search is performed to determine whether
      // this edge is a dead end or leads to the sink.
      //
      // right_[irhs] == kUnused means that there is residual flow from
      // right node irhs to the sink, so we can use that to finish this
      // flow path and return success.
      //
      // Otherwise there is residual flow to some ilhs. We push flow
      // along that path and call ourselves recursively to see if this
      // ultimately leads to sink.
      if (right_[irhs] == kUnused || TryAugment(right_[irhs], seen)) {
        // Add flow from left_[ilhs] to right_[irhs].
        left_[ilhs] = irhs;
        right_[irhs] = ilhs;
        return true;
      }
    }
    return false;
  }